

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

void __thiscall
UCAFL::_uc_hook_cmplog(UCAFL *this,uint64_t cur_loc,uint64_t arg1,uint64_t arg2,uint32_t size)

{
  cmp_map *pcVar1;
  ushort uVar2;
  ulong uVar3;
  ushort local_46;
  uint16_t hits;
  uint32_t shape;
  uintptr_t k;
  cmp_map *map;
  uint32_t size_local;
  uint64_t arg2_local;
  uint64_t arg1_local;
  uint64_t cur_loc_local;
  UCAFL *this_local;
  
  pcVar1 = this->cmpmap_;
  uVar3 = cur_loc & 0xffff;
  uVar2 = 0;
  if (size == 0x10) {
    uVar2 = 1;
  }
  else if (size == 0x20) {
    uVar2 = 3;
  }
  else if (size == 0x40) {
    uVar2 = 7;
  }
  if (((ushort)pcVar1->headers[uVar3] >> 0xb & 1) == 0) {
    local_46 = (ushort)pcVar1->headers[uVar3] & 0x3f;
    pcVar1->headers[uVar3] =
         (cmp_header)((ushort)pcVar1->headers[uVar3] & 0xffc0 | local_46 + 1 & 0x3f);
    if (((ushort)pcVar1->headers[uVar3] >> 6 & 0x1f) < uVar2) {
      pcVar1->headers[uVar3] = (cmp_header)((ushort)pcVar1->headers[uVar3] & 0xf83f | uVar2 << 6);
    }
  }
  else {
    pcVar1->headers[uVar3] = (cmp_header)((ushort)pcVar1->headers[uVar3] & 0xf7ff);
    pcVar1->headers[uVar3] = (cmp_header)((ushort)pcVar1->headers[uVar3] & 0xffc0 | 1);
    pcVar1->headers[uVar3] = (cmp_header)((ushort)pcVar1->headers[uVar3] & 0xf83f | uVar2 << 6);
    local_46 = 0;
  }
  pcVar1->log[uVar3][local_46 & 0x1f].v0 = arg1;
  pcVar1->log[uVar3][local_46 & 0x1f].v1 = arg2;
  return;
}

Assistant:

void _uc_hook_cmplog(uint64_t cur_loc, uint64_t arg1, uint64_t arg2, uint32_t size) {
        struct cmp_map* map = this->cmpmap_;

        uintptr_t k = (uintptr_t)cur_loc & (CMP_MAP_W - 1);
        uint32_t shape = 0;
        switch (size) {
            case 16:
                shape = 1;
                break;
            case 32:
                shape = 3;
                break;
            case 64:
                shape = 7;
                break;
            default:
                break;
        }

        // get hits count
        uint16_t hits;
        if (map->headers[k].type != CMP_TYPE_INS) {
            map->headers[k].type = CMP_TYPE_INS;
            map->headers[k].hits = 1;
            map->headers[k].shape = shape;
            hits = 0;
        } else {
            hits = map->headers[k].hits++;
            if (map->headers[k].shape < shape) {
                map->headers[k].shape = shape;
            }
        }

        hits &= CMP_MAP_H - 1;
        map->log[k][hits].v0 = arg1;
        map->log[k][hits].v1 = arg2;
    }